

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::PassColorsDown(NeuralNetworkShaper *this,NeuralNetworkLayer *layer)

{
  void **ppvVar1;
  Rep *pRVar2;
  _Rep_type *p_Var3;
  long lVar4;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  _Rb_tree_node_base *p_Var5;
  void **ppvVar6;
  int color;
  _Rb_tree_color local_54;
  mapped_type *local_50;
  void **local_48;
  NeuralNetworkLayer *local_40;
  void **local_38;
  
  pRVar2 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
  local_38 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    local_38 = (void **)0x0;
  }
  lVar4 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar4 != 0) {
    local_48 = local_38 + lVar4;
    local_40 = layer;
    do {
      local_50 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::operator[](&this->blobColors,(key_type *)*local_38);
      pRVar2 = (local_40->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      lVar4 = (long)(local_40->output_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        ppvVar1 = ppvVar6 + lVar4;
        p_Var3 = &local_50->_M_t;
        do {
          this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->blobColors,(key_type *)*ppvVar6);
          for (p_Var5 = (local_50->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != &(p_Var3->_M_impl).super__Rb_tree_header;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            local_54 = p_Var5[1]._M_color;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_00,(int *)&local_54);
          }
          ppvVar6 = ppvVar6 + 1;
        } while (ppvVar6 != ppvVar1);
      }
      local_38 = local_38 + 1;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::PassColorsDown(const Specification::NeuralNetworkLayer& layer) {
    for (const auto& inname: layer.input()) {
        const std::set<int>& inset = blobColors[inname];
        for (const auto& outname: layer.output()) {
            std::set<int>& outset = blobColors[outname];
            for (int color: inset) {
                outset.insert(color);
            }
        }
    }
}